

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O2

enable_if_t<std::is_base_of_v<Serializable,_Bar>,_void> __thiscall
miyuki::serialize::InputArchive::_load<Bar>(InputArchive *this,shared_ptr<Bar> *ptr)

{
  pointer *pprVar1;
  pointer *ppiVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  undefined4 extraout_var;
  pointer pcVar8;
  iterator iVar9;
  long lVar10;
  Bar *pBVar11;
  __shared_ptr<miyuki::serialize::Serializable,(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<char> local_99;
  key_type local_98;
  key_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_s;
  long *plVar7;
  
  pbVar3 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  if (pbVar3->m_type == null) {
    type_s._M_dataplus._M_p = (pointer)0x0;
    type_s._M_string_length = 0;
    std::__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2> *)&type_s);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&type_s._M_string_length);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"type",(allocator<char> *)&local_78);
  pvVar6 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(pbVar3,&local_98);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&type_s,pvVar6);
  std::__cxx11::string::~string((string *)&local_98);
  iVar5 = (**this->context->_vptr_Context)(this->context,&type_s);
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>
                    ((this->stack).
                     super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data,(char (*) [6])"props");
  if (!bVar4) {
    pbVar3 = (this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"addr",&local_99);
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(pbVar3,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_98,pvVar6);
    pcVar8 = (pointer)std::__cxx11::stol(&local_98,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    local_78._M_dataplus._M_p = pcVar8;
    std::__detail::
    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)&this->ptrs,(key_type *)&local_78);
    std::dynamic_pointer_cast<Bar,miyuki::serialize::Serializable>
              ((shared_ptr<miyuki::serialize::Serializable> *)&local_98);
    std::__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
    goto LAB_0011276d;
  }
  bVar4 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>
                    ((this->stack).
                     super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data,(char (*) [5])"addr");
  if (bVar4) {
    pbVar3 = (this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"addr",&local_99);
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(pbVar3,&local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_98,pvVar6);
    pcVar8 = (pointer)std::__cxx11::stol(&local_98,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    local_98._M_dataplus._M_p = pcVar8;
    iVar9 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->ptrs)._M_h,(key_type *)&local_98);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      std::dynamic_pointer_cast<Bar,miyuki::serialize::Serializable>
                ((shared_ptr<miyuki::serialize::Serializable> *)&local_98);
      goto LAB_00112702;
    }
    lVar10 = (**(code **)(*plVar7 + 8))(plVar7);
    if (lVar10 == 0) {
      pBVar11 = (Bar *)0x0;
    }
    else {
      pBVar11 = (Bar *)__dynamic_cast(lVar10,&Serializable::typeinfo,&Bar::typeinfo,0);
    }
    std::__shared_ptr<Bar,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Bar,void>
              ((__shared_ptr<Bar,(__gnu_cxx::_Lock_policy)2> *)&local_98,pBVar11);
    std::__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
    local_98._M_dataplus._M_p = pcVar8;
    this_00 = (__shared_ptr<miyuki::serialize::Serializable,(__gnu_cxx::_Lock_policy)2> *)
              std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<miyuki::serialize::Serializable>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->ptrs,(key_type *)&local_98);
    std::__shared_ptr<miyuki::serialize::Serializable,(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    lVar10 = (**(code **)(*plVar7 + 8))(plVar7);
    if (lVar10 == 0) {
      pBVar11 = (Bar *)0x0;
    }
    else {
      pBVar11 = (Bar *)__dynamic_cast(lVar10,&Serializable::typeinfo,&Bar::typeinfo,0);
    }
    std::__shared_ptr<Bar,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Bar,void>
              ((__shared_ptr<Bar,(__gnu_cxx::_Lock_policy)2> *)&local_98,pBVar11);
LAB_00112702:
    std::__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
  }
  pbVar3 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"props",(allocator<char> *)&local_78);
  pvVar6 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(pbVar3,&local_98);
  _makeNode(this,pvVar6);
  std::__cxx11::string::~string((string *)&local_98);
  (**(code **)(*plVar7 + 0x18))
            (plVar7,(ptr->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,this);
  pprVar1 = &(this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pprVar1 = *pprVar1 + -1;
  ppiVar2 = &(this->counter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar2 = *ppiVar2 + -1;
LAB_0011276d:
  std::__cxx11::string::~string((string *)&type_s);
  return;
}

Assistant:

std::enable_if_t<std::is_base_of_v<Serializable, T>, void>
        _load(std::shared_ptr<T> &ptr) {
            if (_top().is_null()) {
                ptr = nullptr;
                return;
            }
            auto type_s = _top().at("type").get<std::string>();
            auto type = context.getType(type_s);
            if (_top().contains("props")) {
                if (_top().contains("addr")) {
                    auto addr = std::stol(_top().at("addr").get<std::string>());
                    auto it = ptrs.find(addr);
                    if (it == ptrs.end()) {
                        ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                        ptrs[addr] = ptr;
                    } else {
                        ptr = std::dynamic_pointer_cast<T>(it->second);
                    }
                } else {
                    ptr = std::shared_ptr<T>(dynamic_cast<T *>(type->_create()));
                }
                _makeNode(_top().at("props"));
                type->load(*ptr, *this);
                _popNode();
            } else {
                auto addr = std::stol(_top().at("addr").get<std::string>());
                ptr = std::dynamic_pointer_cast<T>(ptrs.at(addr));
            }
        }